

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

UniValue *
wallet::FinishTransaction
          (shared_ptr<wallet::CWallet> *pwallet,UniValue *options,CMutableTransaction *rawTx)

{
  long lVar1;
  string_view str;
  bool bVar2;
  undefined1 uVar3;
  bool bVar4;
  _Optional_payload_base<common::PSBTError> this;
  undefined8 uVar5;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  bool add_to_wallet;
  bool psbt_opt_in;
  UniValue *result;
  CTransactionRef tx;
  DataStream ssTx;
  CMutableTransaction mtx;
  bool complete;
  optional<common::PSBTError> err;
  string hex;
  PartiallySignedTransaction psbtx;
  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffff8d8;
  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  PartiallySignedTransaction *this_01;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff8e4;
  UniValue *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  VType in_stack_fffffffffffff8f4;
  UniValue *in_stack_fffffffffffff8f8;
  PartiallySignedTransaction *in_stack_fffffffffffff900;
  char *in_stack_fffffffffffff908;
  CTransaction *in_stack_fffffffffffff910;
  PSBTError err_00;
  CTransaction *in_stack_fffffffffffff918;
  element_type *in_stack_fffffffffffff920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff928;
  CMutableTransaction *in_stack_fffffffffffff930;
  PartiallySignedTransaction *in_stack_fffffffffffff938;
  bool local_6a2;
  undefined8 in_stack_fffffffffffff998;
  bool *in_stack_fffffffffffff9a0;
  PartiallySignedTransaction *in_stack_fffffffffffff9a8;
  undefined6 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b6;
  undefined1 in_stack_fffffffffffff9b7;
  undefined7 in_stack_fffffffffffff9d0;
  mapValue_t *in_stack_fffffffffffff9d8;
  CTransactionRef *in_stack_fffffffffffff9e0;
  allocator<char> local_59a;
  allocator<char> local_599;
  undefined8 local_598;
  CTransaction *pCStack_590;
  undefined8 local_588;
  undefined1 local_578 [47];
  allocator<char> local_549;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  allocator<char> local_51c;
  allocator<char> local_51b;
  allocator<char> local_51a;
  allocator<char> local_519 [64];
  byte local_4d9;
  _Optional_payload_base<common::PSBTError> local_4d8;
  _Optional_payload_base<common::PSBTError> local_4d0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  size_t *in_stack_fffffffffffffc70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PartiallySignedTransaction::PartiallySignedTransaction
            (in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  _GLOBAL__N_1::std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(in_stack_fffffffffffff8d8);
  this_00 = (__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x0;
  local_4d0 = (_Optional_payload_base<common::PSBTError>)
              CWallet::FillPSBT((CWallet *)
                                CONCAT17(in_stack_fffffffffffff9b7,
                                         CONCAT16(in_stack_fffffffffffff9b6,
                                                  in_stack_fffffffffffff9b0)),
                                in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                                (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                                SUB81((ulong)in_stack_fffffffffffff998 >> 0x38,0),
                                SUB81((ulong)in_stack_fffffffffffff998 >> 0x30,0),
                                in_stack_fffffffffffffc70,
                                SUB81((ulong)in_stack_fffffffffffff998 >> 0x28,0));
  _GLOBAL__N_1::std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(this_00);
  uVar6 = 1;
  this_01 = (PartiallySignedTransaction *)0x0;
  this = (_Optional_payload_base<common::PSBTError>)
         CWallet::FillPSBT((CWallet *)
                           CONCAT17(in_stack_fffffffffffff9b7,
                                    CONCAT16(in_stack_fffffffffffff9b6,in_stack_fffffffffffff9b0)),
                           in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                           (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffff998 >> 0x38,0),
                           SUB81((ulong)in_stack_fffffffffffff998 >> 0x30,0),
                           in_stack_fffffffffffffc70,
                           SUB81((ulong)in_stack_fffffffffffff998 >> 0x28,0));
  local_4d8 = this;
  bVar2 = std::optional::operator_cast_to_bool((optional<common::PSBTError> *)this_01);
  if (bVar2) {
    uVar5 = __cxa_allocate_exception(0x58);
    err_00 = (PSBTError)((ulong)in_stack_fffffffffffff910 >> 0x20);
    std::optional<common::PSBTError>::operator*((optional<common::PSBTError> *)this_01);
    JSONRPCPSBTError(err_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)this_01);
    uVar3 = FinalizeAndExtractPSBT
                      (in_stack_fffffffffffff900,(CMutableTransaction *)in_stack_fffffffffffff8f8);
    local_4d9 = uVar3;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    UniValue::UniValue(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f4,
                       (string *)in_stack_fffffffffffff8e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,
               (allocator<char> *)in_stack_fffffffffffff918);
    bVar4 = UniValue::exists((UniValue *)CONCAT44(in_stack_fffffffffffff8e4,uVar6),(string *)this_01
                            );
    bVar2 = false;
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,
                 (allocator<char> *)in_stack_fffffffffffff918);
      UniValue::operator[]
                (in_stack_fffffffffffff8e8,(string *)CONCAT44(in_stack_fffffffffffff8e4,uVar6));
      bVar2 = UniValue::get_bool((UniValue *)CONCAT44(in_stack_fffffffffffff8e4,uVar6));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      std::allocator<char>::~allocator(&local_51a);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::allocator<char>::~allocator(local_519);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,
               (allocator<char> *)in_stack_fffffffffffff918);
    bVar4 = UniValue::exists((UniValue *)CONCAT44(in_stack_fffffffffffff8e4,uVar6),(string *)this_01
                            );
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,
                 (allocator<char> *)in_stack_fffffffffffff918);
      UniValue::operator[]
                (in_stack_fffffffffffff8e8,(string *)CONCAT44(in_stack_fffffffffffff8e4,uVar6));
      local_6a2 = UniValue::get_bool((UniValue *)CONCAT44(in_stack_fffffffffffff8e4,uVar6));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      std::allocator<char>::~allocator(&local_51c);
    }
    else {
      local_6a2 = true;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::allocator<char>::~allocator(&local_51b);
    if (((bVar2 != false) || ((local_4d9 & 1) == 0)) || (local_6a2 == false)) {
      local_538 = 0;
      uStack_530 = 0;
      local_548 = 0;
      uStack_540 = 0;
      DataStream::DataStream((DataStream *)this_01);
      DataStream::operator<<
                ((DataStream *)in_stack_fffffffffffff8e8,
                 (PartiallySignedTransaction *)CONCAT44(in_stack_fffffffffffff8e4,uVar6));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,
                 (allocator<char> *)in_stack_fffffffffffff918);
      DataStream::str_abi_cxx11_((DataStream *)in_stack_fffffffffffff928);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8);
      str._M_str = in_stack_fffffffffffff908;
      str._M_len = (size_t)in_stack_fffffffffffff900;
      EncodeBase64_abi_cxx11_(str);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)in_stack_fffffffffffff918,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff910);
      UniValue::pushKV((UniValue *)in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
                       (UniValue *)in_stack_fffffffffffff910);
      UniValue::~UniValue((UniValue *)this_01);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      std::allocator<char>::~allocator(&local_549);
      DataStream::~DataStream((DataStream *)this_01);
    }
    if ((local_4d9 & 1) != 0) {
      CTransaction::CTransaction
                (in_stack_fffffffffffff918,(CMutableTransaction *)in_stack_fffffffffffff910);
      EncodeHexTx_abi_cxx11_(in_stack_fffffffffffff910);
      CTransaction::~CTransaction((CTransaction *)this_01);
      MakeTransactionRef<CMutableTransaction>
                ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffff8e4,uVar6));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,
                 (allocator<char> *)in_stack_fffffffffffff918);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this_01);
      CTransaction::GetHash((CTransaction *)this_01);
      transaction_identifier<false>::GetHex_abi_cxx11_
                ((transaction_identifier<false> *)CONCAT44(in_stack_fffffffffffff8e4,uVar6));
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)in_stack_fffffffffffff918,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff910);
      UniValue::pushKV((UniValue *)in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
                       (UniValue *)in_stack_fffffffffffff910);
      UniValue::~UniValue((UniValue *)this_01);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      std::allocator<char>::~allocator((allocator<char> *)(local_578 + 0x17));
      if ((local_6a2 == false) || (bVar2 != false)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,
                   (allocator<char> *)in_stack_fffffffffffff918);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((UniValue *)in_stack_fffffffffffff918,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff910);
        UniValue::pushKV((UniValue *)in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
                         (UniValue *)in_stack_fffffffffffff910);
        UniValue::~UniValue((UniValue *)this_01);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
        std::allocator<char>::~allocator(&local_599);
      }
      else {
        in_stack_fffffffffffff920 =
             _GLOBAL__N_1::std::
             __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
        in_stack_fffffffffffff928 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578;
        std::shared_ptr<const_CTransaction>::shared_ptr
                  ((shared_ptr<const_CTransaction> *)this_01,
                   (shared_ptr<const_CTransaction> *)0xcb9ab5);
        uVar5 = 0;
        in_stack_fffffffffffff910 = (CTransaction *)0x0;
        local_3b8 = 0;
        uStack_3b0 = 0;
        local_3c8 = 0;
        uStack_3c0 = 0;
        local_3d8 = 0;
        uStack_3d0 = 0;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this_01);
        local_588 = 0;
        local_598 = uVar5;
        pCStack_590 = in_stack_fffffffffffff910;
        _GLOBAL__N_1::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_01);
        CWallet::CommitTransaction
                  ((CWallet *)this,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT17(uVar3,in_stack_fffffffffffff9d0));
        _GLOBAL__N_1::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff8e8);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this_01);
        std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
      }
      std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920,
               (allocator<char> *)in_stack_fffffffffffff918);
    UniValue::UniValue<bool_&,_bool,_true>
              ((UniValue *)in_stack_fffffffffffff918,(bool *)in_stack_fffffffffffff910);
    UniValue::pushKV((UniValue *)in_stack_fffffffffffff920,(string *)in_stack_fffffffffffff918,
                     (UniValue *)in_stack_fffffffffffff910);
    UniValue::~UniValue((UniValue *)this_01);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::allocator<char>::~allocator(&local_59a);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_01);
    PartiallySignedTransaction::~PartiallySignedTransaction(this_01);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return in_RDI;
    }
  }
  __stack_chk_fail();
}

Assistant:

static UniValue FinishTransaction(const std::shared_ptr<CWallet> pwallet, const UniValue& options, const CMutableTransaction& rawTx)
{
    // Make a blank psbt
    PartiallySignedTransaction psbtx(rawTx);

    // First fill transaction with our data without signing,
    // so external signers are not asked to sign more than once.
    bool complete;
    pwallet->FillPSBT(psbtx, complete, SIGHASH_DEFAULT, /*sign=*/false, /*bip32derivs=*/true);
    const auto err{pwallet->FillPSBT(psbtx, complete, SIGHASH_DEFAULT, /*sign=*/true, /*bip32derivs=*/false)};
    if (err) {
        throw JSONRPCPSBTError(*err);
    }

    CMutableTransaction mtx;
    complete = FinalizeAndExtractPSBT(psbtx, mtx);

    UniValue result(UniValue::VOBJ);

    const bool psbt_opt_in{options.exists("psbt") && options["psbt"].get_bool()};
    bool add_to_wallet{options.exists("add_to_wallet") ? options["add_to_wallet"].get_bool() : true};
    if (psbt_opt_in || !complete || !add_to_wallet) {
        // Serialize the PSBT
        DataStream ssTx{};
        ssTx << psbtx;
        result.pushKV("psbt", EncodeBase64(ssTx.str()));
    }

    if (complete) {
        std::string hex{EncodeHexTx(CTransaction(mtx))};
        CTransactionRef tx(MakeTransactionRef(std::move(mtx)));
        result.pushKV("txid", tx->GetHash().GetHex());
        if (add_to_wallet && !psbt_opt_in) {
            pwallet->CommitTransaction(tx, {}, /*orderForm=*/{});
        } else {
            result.pushKV("hex", hex);
        }
    }
    result.pushKV("complete", complete);

    return result;
}